

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventAgent.h
# Opt level: O1

ssize_t __thiscall
SyncRetEventAgent<TestClass::CopyCounterGuy>::send
          (SyncRetEventAgent<TestClass::CopyCounterGuy> *this,int __fd,void *__buf,size_t __n,
          int __flags)

{
  int *piVar1;
  char cVar2;
  undefined4 in_register_00000034;
  EventAgent *pEVar3;
  SmartPtr<EventAgent> holdMe;
  SmartPtr<EventAgent> local_28;
  
  pEVar3 = (EventAgent *)CONCAT44(in_register_00000034,__fd);
  local_28.mObj = pEVar3;
  pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
  piVar1 = &(pEVar3->super_Event).super_RefCount.mRefCount;
  *piVar1 = *piVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  cVar2 = (**(code **)(*__buf + 0x38))(__buf);
  if (cVar2 == '\0') {
    (*(code *)**__buf)(__buf,pEVar3);
  }
  else {
    (*(pEVar3->super_Event).super_RefCount._vptr_RefCount[3])(pEVar3);
  }
  *(int *)this = *(int *)&(pEVar3->super_Event).field_0x14 + 1;
  SmartPtr<EventAgent>::~SmartPtr(&local_28);
  return (ssize_t)this;
}

Assistant:

ReturnType send(IEventDispatcher *dispatcher)
	{
		// The SyncRetEventAgent needs to make sure that after it
		// is dispatched and delivered the agent remains valid until
		// we are ready to return the value we filled in in the deliver
		// method.   In this case though we are going to use the
		// SmartPtr<> template and C++ scoping to do the AddRef and
		// Release so that we can return mRetValue directly without
		// making an explicit copy on the stack.
		
		// This is necessary because as soon as the dispatcher->sendEventSync
		// returns the only gauranteed reference to "this" object is the
		// one that is taken in this method.   Once we release that reference
		// "this" is possibly invalid and should not be accessed by again
		// before the method returns.
		
		SmartPtr<EventAgent> holdMe = this;
		
		if (dispatcher->isThreadCurrent())
		{
			deliver();
		}
		else
		{
			dispatcher->sendEventSync(this);
		}
		
		// Return the filled in return value.   This will make
		// an appropriate copy of mRetValue before the SmartPtr<>
		// falls out of scope and releases this object.
		return mRetValue;
	}